

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O0

void __thiscall
AssertionTest_assertFalseHandlerShouldBeCalled_Test::
~AssertionTest_assertFalseHandlerShouldBeCalled_Test
          (AssertionTest_assertFalseHandlerShouldBeCalled_Test *this)

{
  AssertionTest_assertFalseHandlerShouldBeCalled_Test *this_local;
  
  ~AssertionTest_assertFalseHandlerShouldBeCalled_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(AssertionTest, assertFalseHandlerShouldBeCalled)
{
    bool condition = true;
    CPP_ASSERT_FALSE(condition);
    EXPECT_EQ(1, assertionHandlerCounter_);
}